

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O3

unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
__thiscall
duckdb::ParquetMultiFileInfo::InitializeBindData
          (ParquetMultiFileInfo *this,MultiFileBindData *multi_file_data,
          unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
          *options_p)

{
  undefined2 uVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  idx_t iVar2;
  ulong uVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pointer pPVar6;
  int iVar7;
  pointer pBVar8;
  pointer pPVar9;
  MultiFileList *pMVar10;
  undefined4 extraout_var;
  _Tuple_impl<0UL,_duckdb::ParquetReadBindData_*,_std::default_delete<duckdb::ParquetReadBindData>_>
  local_40;
  vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_> local_38
  ;
  
  local_40.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl =
       (_Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>)operator_new(0x78);
  (((ParquetReadBindData *)
   local_40.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  super_TableFunctionData).super_FunctionData._vptr_FunctionData = (_func_int **)0x0;
  (((ParquetReadBindData *)
   local_40.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  super_TableFunctionData).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  *(undefined8 *)
   &(((ParquetReadBindData *)
     local_40.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
    parquet_options).debug_use_openssl = 0;
  (((ParquetReadBindData *)
   local_40.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  parquet_options).schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (((ParquetReadBindData *)
   local_40.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  super_TableFunctionData).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (((ParquetReadBindData *)
   local_40.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  super_TableFunctionData).column_ids.super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ((ParquetReadBindData *)
  local_40.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  initial_file_cardinality = 0;
  ((ParquetReadBindData *)
  local_40.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  initial_file_row_groups = 0;
  ((ParquetReadBindData *)
  local_40.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  explicit_cardinality = 0;
  (((ParquetReadBindData *)
   local_40.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  parquet_options).binary_as_string = false;
  (((ParquetReadBindData *)
   local_40.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  parquet_options).file_row_number = false;
  *(undefined6 *)
   &(((ParquetReadBindData *)
     local_40.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
    parquet_options).field_0x2 = 0;
  (((ParquetReadBindData *)
   local_40.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  parquet_options).encryption_config.internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (((ParquetReadBindData *)
   local_40.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  parquet_options).encryption_config.internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (((ParquetReadBindData *)
   local_40.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  super_TableFunctionData).super_FunctionData._vptr_FunctionData =
       (_func_int **)&PTR__ParquetReadBindData_019a4ae8;
  (((ParquetReadBindData *)
   local_40.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  parquet_options).debug_use_openssl = true;
  (((ParquetReadBindData *)
   local_40.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  parquet_options).schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (((ParquetReadBindData *)
   local_40.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  parquet_options).explicit_cardinality = 0;
  (((ParquetReadBindData *)
   local_40.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  parquet_options).schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (((ParquetReadBindData *)
   local_40.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl)->
  parquet_options).schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pBVar8 = unique_ptr<duckdb::BaseFileReaderOptions,_std::default_delete<duckdb::BaseFileReaderOptions>,_true>
           ::operator->(options_p);
  pPVar9 = unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
           ::operator->((unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
                         *)&local_40);
  uVar1 = *(undefined2 *)&pBVar8[1]._vptr_BaseFileReaderOptions;
  (pPVar9->parquet_options).binary_as_string = (bool)(char)uVar1;
  (pPVar9->parquet_options).file_row_number = (bool)(char)((ushort)uVar1 >> 8);
  peVar4 = (element_type *)pBVar8[2]._vptr_BaseFileReaderOptions;
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pBVar8[3]._vptr_BaseFileReaderOptions;
  pBVar8[2]._vptr_BaseFileReaderOptions = (_func_int **)0x0;
  pBVar8[3]._vptr_BaseFileReaderOptions = (_func_int **)0x0;
  this_00 = (pPVar9->parquet_options).encryption_config.internal.
            super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (pPVar9->parquet_options).encryption_config.internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  (pPVar9->parquet_options).encryption_config.internal.
  super___shared_ptr<duckdb::ParquetEncryptionConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var5;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (pPVar9->parquet_options).debug_use_openssl = *(bool *)&pBVar8[4]._vptr_BaseFileReaderOptions;
  local_38.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pPVar9->parquet_options).schema.
       super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
       .
       super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  pPVar6 = (pointer)pBVar8[6]._vptr_BaseFileReaderOptions;
  local_38.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pPVar9->parquet_options).schema.
       super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
       .
       super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_38.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pPVar9->parquet_options).schema.
       super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
       .
       super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pPVar9->parquet_options).schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pBVar8[5]._vptr_BaseFileReaderOptions;
  (pPVar9->parquet_options).schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_finish = pPVar6;
  (pPVar9->parquet_options).schema.
  super_vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>.
  super__Vector_base<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)pBVar8[7]._vptr_BaseFileReaderOptions;
  pBVar8[5]._vptr_BaseFileReaderOptions = (_func_int **)0x0;
  pBVar8[6]._vptr_BaseFileReaderOptions = (_func_int **)0x0;
  pBVar8[7]._vptr_BaseFileReaderOptions = (_func_int **)0x0;
  ::std::vector<duckdb::ParquetColumnDefinition,_std::allocator<duckdb::ParquetColumnDefinition>_>::
  ~vector(&local_38);
  (pPVar9->parquet_options).explicit_cardinality = (idx_t)pBVar8[8]._vptr_BaseFileReaderOptions;
  pPVar9 = unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
           ::operator->((unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
                         *)&local_40);
  if ((pPVar9->parquet_options).explicit_cardinality != 0) {
    pMVar10 = shared_ptr<duckdb::MultiFileList,_true>::operator->(&multi_file_data->file_list);
    iVar7 = (*pMVar10->_vptr_MultiFileList[6])(pMVar10);
    pPVar9 = unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
             ::operator->((unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
                           *)&local_40);
    iVar2 = (pPVar9->parquet_options).explicit_cardinality;
    pPVar9 = unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
             ::operator->((unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
                           *)&local_40);
    pPVar9->explicit_cardinality = iVar2;
    pPVar9 = unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
             ::operator->((unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
                           *)&local_40);
    uVar3 = pPVar9->explicit_cardinality;
    pPVar9 = unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
             ::operator->((unique_ptr<duckdb::ParquetReadBindData,_std::default_delete<duckdb::ParquetReadBindData>,_true>
                           *)&local_40);
    pPVar9->initial_file_cardinality =
         uVar3 / (CONCAT44(extraout_var,iVar7) + (ulong)(CONCAT44(extraout_var,iVar7) == 0));
  }
  *(_Head_base<0UL,_duckdb::ParquetReadBindData_*,_false> *)this =
       local_40.super__Head_base<0UL,_duckdb::ParquetReadBindData_*,_false>._M_head_impl;
  return (unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>_>)
         (unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>_>)
         this;
}

Assistant:

unique_ptr<TableFunctionData> ParquetMultiFileInfo::InitializeBindData(MultiFileBindData &multi_file_data,
                                                                       unique_ptr<BaseFileReaderOptions> options_p) {
	auto result = make_uniq<ParquetReadBindData>();
	// Set the explicit cardinality if requested
	auto &options = options_p->Cast<ParquetFileReaderOptions>();
	result->parquet_options = std::move(options.options);
	if (result->parquet_options.explicit_cardinality) {
		auto file_count = multi_file_data.file_list->GetTotalFileCount();
		result->explicit_cardinality = result->parquet_options.explicit_cardinality;
		result->initial_file_cardinality = result->explicit_cardinality / (file_count ? file_count : 1);
	}
	return std::move(result);
}